

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O0

double do_oper(stack<double,_std::deque<double,_std::allocator<double>_>_> *temp,char oper)

{
  double __y;
  double __x;
  reference pvVar1;
  ostream *poVar2;
  double a;
  double b;
  char oper_local;
  stack<double,_std::deque<double,_std::allocator<double>_>_> *temp_local;
  
  pvVar1 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top(temp);
  __y = *pvVar1;
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::pop(temp);
  pvVar1 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top(temp);
  __x = *pvVar1;
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::pop(temp);
  if (oper == '*') {
    temp_local = (stack<double,_std::deque<double,_std::allocator<double>_>_> *)(__x * __y);
  }
  else if (oper == '+') {
    temp_local = (stack<double,_std::deque<double,_std::allocator<double>_>_> *)(__x + __y);
  }
  else if (oper == '-') {
    temp_local = (stack<double,_std::deque<double,_std::allocator<double>_>_> *)(__x - __y);
  }
  else if (oper == '/') {
    temp_local = (stack<double,_std::deque<double,_std::allocator<double>_>_> *)(__x / __y);
  }
  else if (oper == '^') {
    temp_local = (stack<double,_std::deque<double,_std::allocator<double>_>_> *)pow(__x,__y);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"invalid operator ");
    poVar2 = std::operator<<(poVar2,oper);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    temp_local = (stack<double,_std::deque<double,_std::allocator<double>_>_> *)0x0;
  }
  return (double)temp_local;
}

Assistant:

double do_oper (stack<double>& temp, char oper) {
    double b = temp.top(); temp.pop();  // порядок считывания
    double a = temp.top(); temp.pop();
    switch (oper) {
        case '+':
            return a + b;
        case '-':
            return a - b;
        case '*':
            return a * b;
        case '/':
            return a / b;
        case '^':
            return pow(a,b);
        default:
            cout << "invalid operator " << oper << endl;
            return 0;
    }
}